

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

MD_LINE * md_lookup_line(MD_OFFSET off,MD_LINE *lines,MD_SIZE n_lines,MD_SIZE *p_line_index)

{
  MD_LINE *pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  do {
    uVar4 = n_lines - 1;
    while( true ) {
      if (uVar4 < uVar3) {
        return (MD_LINE *)0x0;
      }
      uVar2 = uVar3 + uVar4 >> 1;
      pMVar1 = lines + uVar2;
      if (off < pMVar1->beg) break;
      if (off <= pMVar1->end) goto LAB_00109313;
      uVar3 = uVar2 + 1;
    }
  } while ((uVar4 != 0) && (uVar4 = n_lines - 2, n_lines = uVar2, off <= lines[uVar4].end));
LAB_00109313:
  if (p_line_index != (MD_SIZE *)0x0) {
    *p_line_index = uVar2;
  }
  return pMVar1;
}

Assistant:

static const MD_LINE*
md_lookup_line(OFF off, const MD_LINE* lines, MD_SIZE n_lines, MD_SIZE* p_line_index)
{
    MD_SIZE lo, hi;
    MD_SIZE pivot;
    const MD_LINE* line;

    lo = 0;
    hi = n_lines - 1;
    while(lo <= hi) {
        pivot = (lo + hi) / 2;
        line = &lines[pivot];

        if(off < line->beg) {
            if(hi == 0  ||  lines[hi-1].end < off) {
                if(p_line_index != NULL)
                    *p_line_index = pivot;
                return line;
            }
            hi = pivot - 1;
        } else if(off > line->end) {
            lo = pivot + 1;
        } else {
            if(p_line_index != NULL)
                *p_line_index = pivot;
            return line;
        }
    }

    return NULL;
}